

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O2

bool __thiscall gui::MultilineTextBox::handleKeyPressed(MultilineTextBox *this,KeyEvent *key)

{
  Key KVar1;
  ulong uVar2;
  unsigned_long uVar3;
  uint32_t unicode;
  bool bVar4;
  bool bVar5;
  Uint32 UVar6;
  size_t sVar7;
  Iterator IVar8;
  Iterator IVar9;
  size_t sVar10;
  pointer puVar11;
  int delta;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *caretPosition;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *pbVar12
  ;
  byte bVar13;
  String *pSVar14;
  pointer puVar15;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_58
  ;
  anon_class_8_1_8991fb9c getSelectedText;
  
  caretPosition = &local_58;
  pbVar12 = &local_58;
  bVar4 = Widget::handleKeyPressed(&this->super_Widget,key);
  sVar7 = findCaretOffset(this,&this->caretPosition_);
  KVar1 = key->code;
  getSelectedText.this = this;
  if (key->control == true) {
    switch(KVar1) {
    case Left:
      puVar15 = (pointer)(this->caretPosition_).x;
      if (puVar15 == (pointer)0x0) {
        if (sVar7 == 0) {
          return true;
        }
        sVar7 = sVar7 - 1;
LAB_00182967:
        updateCaretPosition(this,sVar7,key->shift);
        return true;
      }
      pSVar14 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
      bVar4 = false;
      do {
        while( true ) {
          puVar11 = puVar15;
          puVar15 = (pointer)((long)puVar11 - 1);
          if (puVar15 == (pointer)0x0) goto LAB_001828d8;
          UVar6 = sf::String::operator[](pSVar14,(size_t)puVar15);
          if (UVar6 == 0x20) break;
          bVar4 = true;
        }
      } while (!bVar4);
LAB_001828d8:
      UVar6 = sf::String::operator[](pSVar14,(size_t)puVar15);
      if (!bVar4) {
        puVar11 = puVar15;
      }
      local_58._M_dataplus._M_p = puVar11;
      if (UVar6 != 0x20) {
        local_58._M_dataplus._M_p = puVar15;
      }
      local_58._M_string_length = (this->caretPosition_).y;
      break;
    case Right:
      uVar2 = (this->caretPosition_).x;
      sVar10 = sf::String::getSize((this->boxStrings_).
                                   super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                                   _M_impl.super__Vector_impl_data._M_start +
                                   (this->caretPosition_).y);
      if (sVar10 <= uVar2) {
        sVar10 = anon_unknown.dwarf_392173::findStringsLength(&this->boxStrings_);
        if (sVar10 <= sVar7) {
          return true;
        }
        sVar7 = sVar7 + 1;
        goto LAB_00182967;
      }
      puVar15 = (pointer)(this->caretPosition_).x;
      pSVar14 = (this->boxStrings_).super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                _M_impl.super__Vector_impl_data._M_start + (this->caretPosition_).y;
      for (bVar13 = 0;
          (puVar11 = (pointer)sf::String::getSize(pSVar14), puVar15 < puVar11 &&
          ((UVar6 = sf::String::operator[](pSVar14,(size_t)puVar15), UVar6 == 0x20 ||
           ((bool)(bVar13 ^ 1))))); bVar13 = bVar13 | UVar6 == 0x20) {
        puVar15 = (pointer)((long)puVar15 + 1);
      }
      local_58._M_string_length = (this->caretPosition_).y;
      local_58._M_dataplus._M_p = puVar15;
      break;
    case Up:
      bVar4 = key->shift;
      delta = 1;
      goto LAB_001826a1;
    case Down:
      bVar4 = key->shift;
      delta = -1;
LAB_001826a1:
      updateScroll(this,true,delta,bVar4);
      goto LAB_00182948;
    default:
      if (KVar1 != A) {
        if (KVar1 == C) {
          if ((this->selectionStart_).second != true) {
            return true;
          }
          handleKeyPressed::anon_class_8_1_8991fb9c::operator()
                    ((String *)&local_58,&getSelectedText);
          sf::Clipboard::setString((String *)&local_58);
          std::__cxx11::
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~basic_string(&local_58);
          return true;
        }
        if (KVar1 == V) {
          sf::Clipboard::getString();
          IVar8 = sf::String::begin_abi_cxx11_((String *)&local_58);
          IVar9 = sf::String::end_abi_cxx11_((String *)&local_58);
          bVar13 = 0;
          for (; IVar8._M_current != IVar9._M_current; IVar8._M_current = IVar8._M_current + 1) {
            bVar4 = insertCharacter(this,*IVar8._M_current,true);
            bVar13 = bVar13 | bVar4;
          }
          std::__cxx11::
          basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~basic_string(&local_58);
          if (bVar13 == 0) {
            return true;
          }
          sVar7 = anon_unknown.dwarf_392173::findStringsLength(&this->boxStrings_);
          Signal<gui::Widget_*,_unsigned_long>::emit(&this->onTextChange,&this->super_Widget,sVar7);
          return true;
        }
        if (KVar1 != X) {
          return bVar4;
        }
        if ((this->selectionStart_).second != true) {
          return true;
        }
        handleKeyPressed::anon_class_8_1_8991fb9c::operator()((String *)&local_58,&getSelectedText);
        sf::Clipboard::setString((String *)&local_58);
        std::__cxx11::
        basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
        ~basic_string(&local_58);
        insertCharacter(this,8,false);
        return true;
      }
      updateCaretPosition(this,0,false);
      sVar7 = anon_unknown.dwarf_392173::findStringsLength(&this->boxStrings_);
      bVar4 = true;
      goto LAB_00182943;
    }
LAB_0018292c:
    sVar7 = findCaretOffset(this,(Vector2<unsigned_long> *)&local_58);
    goto LAB_00182938;
  }
  switch(KVar1) {
  case Enter:
    if (this->maxLines_ == 1) {
      return bVar4;
    }
    bVar5 = insertCharacter(this,10,false);
    if (!bVar5) {
      return bVar4;
    }
    break;
  case BackSpace:
    unicode = 8;
    goto LAB_0018286d;
  case Tab:
    if (this->tabPolicy_ == ignoreTab) {
      return bVar4;
    }
    unicode = 9;
    goto LAB_0018286d;
  case PageUp:
    goto switchD_00182590_caseD_3d;
  case PageDown:
    goto switchD_00182590_caseD_3e;
  case End:
    local_58._M_dataplus._M_p =
         (pointer)sf::String::getSize((this->boxStrings_).
                                      super__Vector_base<sf::String,_std::allocator<sf::String>_>.
                                      _M_impl.super__Vector_impl_data._M_start +
                                      (this->caretPosition_).y);
    local_58._M_string_length = (this->caretPosition_).y;
    goto LAB_00182859;
  case Home:
    local_58._M_string_length = (this->caretPosition_).y;
    local_58._M_dataplus._M_p = (pointer)0x0;
LAB_00182859:
    bVar4 = key->shift;
LAB_00182861:
    updateCaretPosition(this,(Vector2<unsigned_long> *)caretPosition,bVar4);
    break;
  default:
    goto switchD_00182590_caseD_41;
  case Delete:
    unicode = 0x7f;
LAB_0018286d:
    insertCharacter(this,unicode,false);
    break;
  case Left:
    if (((this->selectionStart_).second != true) || (key->shift != false)) {
      if (sVar7 != 0) {
        sVar7 = sVar7 - 1;
LAB_001828cb:
        bVar4 = key->shift;
        goto LAB_00182943;
      }
      break;
    }
    anon_unknown.dwarf_392173::sortByYFirst<unsigned_long>
              ((pair<sf::Vector2<unsigned_long>,_sf::Vector2<unsigned_long>_> *)&local_58,
               &(this->selectionStart_).first,&this->selectionEnd_);
LAB_001829b8:
    bVar4 = false;
    caretPosition = pbVar12;
    goto LAB_00182861;
  case Right:
    if (((this->selectionStart_).second == true) && (key->shift == false)) {
      anon_unknown.dwarf_392173::sortByYFirst<unsigned_long>
                ((pair<sf::Vector2<unsigned_long>,_sf::Vector2<unsigned_long>_> *)&local_58,
                 &(this->selectionStart_).first,&this->selectionEnd_);
      pbVar12 = (basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_58.field_2;
      goto LAB_001829b8;
    }
    sVar10 = anon_unknown.dwarf_392173::findStringsLength(&this->boxStrings_);
    if (sVar7 < sVar10) {
      sVar7 = sVar7 + 1;
      goto LAB_001828cb;
    }
    break;
  case Up:
    uVar3 = (this->caretPosition_).y;
    if (uVar3 != 0) {
      local_58._M_dataplus._M_p = (pointer)(this->caretPosition_).x;
      local_58._M_string_length = uVar3 - 1;
      goto LAB_0018292c;
    }
    goto switchD_00182590_caseD_3d;
  case Down:
    uVar2 = (this->caretPosition_).y;
    if (uVar2 < ((long)(this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->boxStrings_).
                       super__Vector_base<sf::String,_std::allocator<sf::String>_>._M_impl.
                       super__Vector_impl_data._M_start >> 5) - 1U) {
      local_58._M_dataplus._M_p = (pointer)(this->caretPosition_).x;
      local_58._M_string_length = uVar2 + 1;
      goto LAB_0018292c;
    }
    goto switchD_00182590_caseD_3e;
  }
LAB_00182948:
  bVar4 = true;
switchD_00182590_caseD_41:
  return bVar4;
switchD_00182590_caseD_3e:
  sVar7 = anon_unknown.dwarf_392173::findStringsLength(&this->boxStrings_);
LAB_00182938:
  bVar4 = key->shift;
  goto LAB_00182943;
switchD_00182590_caseD_3d:
  bVar4 = key->shift;
  sVar7 = 0;
LAB_00182943:
  updateCaretPosition(this,sVar7,bVar4);
  goto LAB_00182948;
}

Assistant:

bool MultilineTextBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    size_t caretOffset = findCaretOffset(caretPosition_);

    auto getSelectedText = [this]() -> sf::String {
        sf::String selectedText = "";
        auto selection = sortByYFirst(selectionStart_.first, selectionEnd_);
        for (size_t y = selection.first.y; y <= selection.second.y; ++y) {
            if (y == selection.first.y) {
                if (y == selection.second.y) {
                    selectedText += boxStrings_[y].substring(selection.first.x, selection.second.x - selection.first.x);
                } else {
                    selectedText += boxStrings_[y].substring(selection.first.x);
                }
            } else if (y > selection.first.y && y < selection.second.y) {
                selectedText += "\n" + boxStrings_[y];
            } else if (y == selection.second.y) {
                selectedText += "\n" + boxStrings_[y].substring(0, selection.second.x);
            }
        }
        GUI_DEBUG << "selectedText = [" << selectedText.toAnsiString() << "]\n";
        return selectedText;
    };

    if (key.control) {
        if (key.code == sf::Keyboard::Up) {
            updateScroll(true, 1, key.shift);
        } else if (key.code == sf::Keyboard::Down) {
            updateScroll(true, -1, key.shift);
        } else if (key.code == sf::Keyboard::Left) {
            if (caretPosition_.x > 0) {
                bool foundNonSpace = false;
                const sf::String& line = boxStrings_[caretPosition_.y];
                size_t i = caretPosition_.x - 1;
                while (i > 0) {
                    if (line[i] != ' ') {
                        foundNonSpace = true;
                    } else if (foundNonSpace) {
                        break;
                    }
                    --i;
                }
                updateCaretPosition(findCaretOffset({(line[i] == ' ' && foundNonSpace ? i + 1 : i), caretPosition_.y}), key.shift);
            } else if (caretOffset > 0) {
                updateCaretPosition(caretOffset - 1, key.shift);
            }
        } else if (key.code == sf::Keyboard::Right) {
            if (caretPosition_.x < boxStrings_[caretPosition_.y].getSize()) {
                bool foundSpace = false;
                const sf::String& line = boxStrings_[caretPosition_.y];
                size_t i = caretPosition_.x;
                while (i < line.getSize()) {
                    if (line[i] == ' ') {
                        foundSpace = true;
                    } else if (foundSpace) {
                        break;
                    }
                    ++i;
                }
                updateCaretPosition(findCaretOffset({i, caretPosition_.y}), key.shift);
            } else if (caretOffset < findStringsLength(boxStrings_)) {
                updateCaretPosition(caretOffset + 1, key.shift);
            }
        } else if (key.code == sf::Keyboard::A) {
            updateCaretPosition(0, false);
            updateCaretPosition(findStringsLength(boxStrings_), true);
        } else if (key.code == sf::Keyboard::X) {
            if (selectionStart_.second) {
                sf::Clipboard::setString(getSelectedText());
                insertCharacter('\u0008');
            }
        } else if (key.code == sf::Keyboard::C) {
            if (selectionStart_.second) {
                sf::Clipboard::setString(getSelectedText());
            }
        } else if (key.code == sf::Keyboard::V) {
            bool textChanged = false;
            for (auto c : sf::Clipboard::getString()) {
                textChanged = insertCharacter(c, true) || textChanged;
            }
            if (textChanged) {
                onTextChange.emit(this, findStringsLength(boxStrings_));
            }
        } else {
            return eventConsumed;
        }
        return true;
    }

    if (key.code == sf::Keyboard::Enter) {
        if (maxLines_ == 1 || !insertCharacter('\u000a')) {
            return eventConsumed;
        }
    } else if (key.code == sf::Keyboard::Backspace) {
        insertCharacter('\u0008');
    } else if (key.code == sf::Keyboard::Tab) {
        if (tabPolicy_ == TabPolicy::ignoreTab) {
            return eventConsumed;
        }
        insertCharacter('\u0009');
    } else if (key.code == sf::Keyboard::Delete) {
        insertCharacter('\u007f');
    } else if (key.code == sf::Keyboard::PageUp) {
        updateCaretPosition(0, key.shift);
    } else if (key.code == sf::Keyboard::PageDown) {
        updateCaretPosition(findStringsLength(boxStrings_), key.shift);
    } else if (key.code == sf::Keyboard::Home) {
        updateCaretPosition({0, caretPosition_.y}, key.shift);
    } else if (key.code == sf::Keyboard::End) {
        updateCaretPosition({boxStrings_[caretPosition_.y].getSize(), caretPosition_.y}, key.shift);
    } else if (key.code == sf::Keyboard::Up) {
        if (caretPosition_.y > 0) {
            updateCaretPosition(findCaretOffset({caretPosition_.x, caretPosition_.y - 1}), key.shift);
        } else {
            updateCaretPosition(0, key.shift);
        }
    } else if (key.code == sf::Keyboard::Down) {
        if (caretPosition_.y < boxStrings_.size() - 1) {
            updateCaretPosition(findCaretOffset({caretPosition_.x, caretPosition_.y + 1}), key.shift);
        } else {
            updateCaretPosition(findStringsLength(boxStrings_), key.shift);
        }
    } else if (key.code == sf::Keyboard::Left) {
        if (selectionStart_.second && !key.shift) {
            updateCaretPosition(sortByYFirst(selectionStart_.first, selectionEnd_).first, false);
        } else if (caretOffset > 0) {
            updateCaretPosition(caretOffset - 1, key.shift);
        }
    } else if (key.code == sf::Keyboard::Right) {
        if (selectionStart_.second && !key.shift) {
            updateCaretPosition(sortByYFirst(selectionStart_.first, selectionEnd_).second, false);
        } else if (caretOffset < findStringsLength(boxStrings_)) {
            updateCaretPosition(caretOffset + 1, key.shift);
        }
    } else {
        return eventConsumed;
    }
    return true;
}